

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

string * __thiscall
wabt::(anonymous_namespace)::TypesToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TypeVector *types,char *prefix
          )

{
  ulong uVar1;
  string *psVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[","");
  if (types != (TypeVector *)0x0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  lVar3 = *(long *)this;
  if (*(long *)(this + 8) != lVar3) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      Type::GetName((Type *)(lVar3 + lVar4));
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      lVar3 = *(long *)this;
      uVar1 = *(long *)(this + 8) - lVar3 >> 2;
      if (uVar5 < uVar1 - 1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        lVar3 = *(long *)this;
        uVar1 = *(long *)(this + 8) - lVar3 >> 2;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 4;
    } while (uVar5 < uVar1);
  }
  psVar2 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  return psVar2;
}

Assistant:

std::string TypesToString(const TypeVector& types,
                          const char* prefix = nullptr) {
  std::string result = "[";
  if (prefix) {
    result += prefix;
  }

  for (size_t i = 0; i < types.size(); ++i) {
    result += types[i].GetName();
    if (i < types.size() - 1) {
      result += ", ";
    }
  }
  result += "]";
  return result;
}